

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O0

void __thiscall
jsoncons::stream_source<unsigned_char>::stream_source(stream_source<unsigned_char> *this)

{
  allocator_type *__n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *puVar1;
  allocator_type *in_RDI;
  allocator_type *__a;
  
  __a = in_RDI;
  basic_null_istream<char>::basic_null_istream((basic_null_istream<char> *)in_RDI);
  *(allocator_type **)(__a + 0x158) = __a;
  __n = __a + 0x160;
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)std::ios::rdbuf();
  *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)__n = this_00;
  *(undefined8 *)(in_RDI + 0x168) = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x227f66);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00,(size_type)__n,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x227f85);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x227f96);
  *(uchar **)(in_RDI + 0x188) = puVar1;
  *(undefined8 *)(in_RDI + 400) = 0;
  return;
}

Assistant:

stream_source()
            : stream_ptr_(&null_is_), sbuf_(null_is_.rdbuf()),
              buffer_(1), buffer_data_(buffer_.data())
        {
        }